

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockIterator.hpp
# Opt level: O0

bool __thiscall
gmlc::containers::BlockIterator<helics::Input_const,32,helics::Input_const*const*>::
checkEquivalence<helics::Input**>
          (BlockIterator<helics::Input_const,32,helics::Input_const*const*> *this,Input **testv,
          int testoffset)

{
  bool local_21;
  int testoffset_local;
  Input **testv_local;
  BlockIterator<const_helics::Input,_32,_const_helics::Input_*const_*> *this_local;
  
  if ((testv == *(Input ***)this) ||
     ((((local_21 = false, testv != (Input **)0x0 && (local_21 = false, *testv == (Input *)0x0)) &&
       (local_21 = false, *(long *)this != 0)) && (local_21 = false, **(long **)this == 0)))) {
    local_21 = testoffset == *(int *)(this + 0x10);
  }
  return local_21;
}

Assistant:

bool checkEquivalence(OUTER2 testv, int testoffset) const
        {
            return (
                (testv == vec ||
                 ((testv != nullptr && *testv == nullptr) &&
                  (vec != nullptr && *vec == nullptr))) &&
                testoffset == offset);
        }